

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O2

int STRING_copy_n(STRING_HANDLE handle,char *s2,size_t n)

{
  size_t sVar1;
  char *__dest;
  LOGGER_LOG p_Var2;
  int iVar3;
  STRING *s1;
  
  iVar3 = 0x20e;
  if (s2 != (char *)0x0 && handle != (STRING_HANDLE)0x0) {
    sVar1 = strlen(s2);
    if (sVar1 < n) {
      n = sVar1;
    }
    sVar1 = 0xffffffffffffffff;
    if (n + 1 != 0) {
      sVar1 = n + 1;
    }
    if ((sVar1 != 0xffffffffffffffff) &&
       (__dest = (char *)realloc(handle->s,sVar1), __dest != (char *)0x0)) {
      handle->s = __dest;
      memcpy(__dest,s2,n);
      __dest[n] = '\0';
      return 0;
    }
    p_Var2 = xlogging_get_log_function();
    iVar3 = 0x220;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/strings.c"
                ,"STRING_copy_n",0x21e,1,"Failure reallocating value. size=%zu",sVar1);
    }
  }
  return iVar3;
}

Assistant:

int STRING_copy_n(STRING_HANDLE handle, const char* s2, size_t n)
{
    int result;
    if ((handle == NULL) || (s2 == NULL))
    {
        /* Codes_SRS_STRING_07_019: [STRING_copy_n shall return a nonzero value if STRING_HANDLE or const char* is NULL.] */
        result = MU_FAILURE;
    }
    else
    {
        STRING* s1 = (STRING*)handle;
        size_t s2Length = strlen(s2);
        char* temp;
        if (s2Length > n)
        {
            s2Length = n;
        }

        size_t realloc_size = safe_add_size_t(s2Length, 1);
        if (realloc_size == SIZE_MAX ||
            (temp = (char*)realloc(s1->s, realloc_size)) == NULL)
        {
            LogError("Failure reallocating value. size=%zu", realloc_size);
            /* Codes_SRS_STRING_07_028: [STRING_copy_n shall return a nonzero value if any error is encountered.] */
            result = MU_FAILURE;
        }
        else
        {
            s1->s = temp;
            (void)memcpy(s1->s, s2, s2Length);
            s1->s[s2Length] = 0;
            result = 0;
        }

    }
    return result;
}